

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_sse41_128_64.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_table_scan_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  long *plVar1;
  uint uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  longlong lVar7;
  int iVar8;
  int iVar9;
  parasail_result_t *ppVar10;
  __m128i *ptr;
  int64_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *palVar11;
  __m128i *palVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  char *pcVar16;
  ulong uVar18;
  uint uVar17;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  ulong size;
  long lVar23;
  ulong uVar24;
  parasail_result_t *ppVar25;
  char *__format;
  long lVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  longlong lVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar40 [16];
  longlong lVar41;
  undefined1 extraout_XMM0_00 [16];
  __m128i_64_t B;
  __m128i alVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  ulong uVar49;
  __m128i_64_t B_1;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  ulong uVar53;
  __m128i_64_t B_4;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  __m128i_64_t B_2;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  int64_t iVar59;
  __m128i_64_t B_3;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  __m128i b;
  __m128i b_00;
  __m128i a;
  __m128i a_00;
  int local_194;
  parasail_result_t *local_190;
  int local_160;
  undefined1 local_148 [16];
  ulong local_138;
  undefined8 uStack_130;
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined1 local_f8 [16];
  ulong uStack_80;
  ulong uStack_70;
  __m128i_64_t e;
  __m128i_64_t h;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar16 = "profile";
  }
  else {
    pvVar3 = (profile->profile64).score;
    if (pvVar3 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar16 = "profile->profile64.score";
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar16 = "profile->matrix";
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar16 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar16 = "s2";
        }
        else {
          uVar20 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            __format = "%s: %s must be > 0\n";
            pcVar16 = "s2Len";
          }
          else if (open < 0) {
            __format = "%s: %s must be >= 0\n";
            pcVar16 = "open";
          }
          else {
            if (-1 < gap) {
              uVar21 = uVar2 - 1;
              size = (ulong)uVar2 + 1 >> 1;
              uVar22 = -open;
              uVar15 = ppVar4->min;
              local_138 = 0x8000000000000000 - (long)(int)uVar15;
              if (uVar15 != uVar22 && SBORROW4(uVar15,uVar22) == (int)(uVar15 + open) < 0) {
                local_138 = (ulong)(uint)open | 0x8000000000000000;
              }
              iVar9 = ppVar4->max;
              ppVar10 = parasail_result_new_table1((uint)((ulong)uVar2 + 1) & 0x7ffffffe,s2Len);
              if (ppVar10 == (parasail_result_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              ppVar10->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar10->flag | 0x2820402;
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1));
              ptr_01 = parasail_memalign___m128i(0x10,size);
              ptr_02 = parasail_memalign___m128i(0x10,size);
              ptr_03 = parasail_memalign___m128i(0x10,size);
              if (ptr_03 == (__m128i *)0x0 ||
                  ((ptr_02 == (__m128i *)0x0 || ptr_01 == (__m128i *)0x0) ||
                  (ptr_00 == (int64_t *)0x0 || ptr == (__m128i *)0x0))) {
                return (parasail_result_t *)0x0;
              }
              iVar8 = s2Len + -1;
              iVar14 = 1 - (int)(uVar21 / size);
              uVar49 = (ulong)(uint)open;
              uVar53 = (ulong)(uint)gap;
              local_190 = (parasail_result_t *)(local_138 + 1);
              lVar23 = 0x7ffffffffffffffe - (long)iVar9;
              auVar45._8_4_ = (int)local_190;
              auVar45._0_8_ = local_190;
              auVar45._12_4_ = (int)((ulong)local_190 >> 0x20);
              local_148._8_4_ = (int)lVar23;
              local_148._0_8_ = lVar23;
              local_148._12_4_ = (int)((ulong)lVar23 >> 0x20);
              auVar43._0_8_ = (long)iVar14;
              auVar43._8_4_ = iVar14;
              auVar43._12_4_ = iVar14 >> 0x1f;
              lVar23 = (long)(int)uVar22;
              for (uVar24 = 0; uVar24 != size; uVar24 = uVar24 + 1) {
                lVar26 = lVar23;
                for (lVar28 = 0; lVar28 != 2; lVar28 = lVar28 + 1) {
                  lVar29 = lVar26;
                  if (s1_beg != 0) {
                    lVar29 = 0;
                  }
                  *(long *)((long)&h + lVar28 * 8) = lVar29;
                  *(ulong *)((long)&e + lVar28 * 8) = lVar29 - (ulong)(uint)open;
                  lVar26 = lVar26 - size * (uint)gap;
                }
                ptr_02[uVar24][0] = h.m[0];
                ptr_02[uVar24][1] = h.m[1];
                ptr[uVar24][0] = e.m[0];
                ptr[uVar24][1] = e.m[1];
                lVar23 = lVar23 - (ulong)(uint)gap;
              }
              *ptr_00 = 0;
              for (uVar24 = 1; ppVar25 = (parasail_result_t *)(ulong)uVar22, s2Len + 1 != uVar24;
                  uVar24 = uVar24 + 1) {
                uVar15 = 0;
                if (s2_beg == 0) {
                  uVar15 = uVar22;
                }
                ptr_00[uVar24] = (long)(int)uVar15;
                uVar22 = uVar22 - gap;
              }
              alVar42[1] = -(ulong)(uint)open;
              alVar42[0] = -uVar49;
              uVar15 = (uint)size;
              for (uVar22 = uVar15 - 1; -1 < (int)uVar22; uVar22 = uVar22 - 1) {
                ptr_03[uVar22] = alVar42;
                lVar23 = alVar42[1];
                alVar42[0] = alVar42[0] - uVar53;
                alVar42[1] = lVar23 - (ulong)(uint)gap;
                auVar52._0_8_ = -(ulong)(local_148._0_8_ < alVar42[0]);
                auVar52._8_8_ = -(ulong)(local_148._8_8_ < alVar42[1]);
                local_148 = blendvpd((undefined1  [16])alVar42,local_148,auVar52);
              }
              palVar11 = ptr_02 + (uVar15 - 1);
              palVar12 = ptr_02 + (ulong)uVar21 % size;
              uVar19 = 0;
              local_f8._8_8_ = auVar43._8_8_;
              local_f8._8_8_ = -(ulong)(local_f8._8_8_ == 0);
              local_f8._0_8_ = -(ulong)(auVar43._0_8_ == 1);
              uVar24 = uVar20;
              uVar27 = 0;
              auVar43 = auVar45;
              auVar52 = auVar45;
              local_194 = iVar8;
              while (uVar27 != uVar20) {
                auVar58._8_4_ = (int)(*palVar11)[0];
                auVar58._0_8_ = (*palVar11)[0];
                auVar58._12_4_ = *(undefined4 *)((long)*palVar11 + 4);
                iVar9 = ppVar4->mapper[(byte)s2[uVar27]];
                auVar61._0_8_ = (long)local_190 - (*ptr_03)[0];
                auVar61._8_8_ = auVar45._8_8_ - (*ptr_03)[1];
                uVar24 = 0;
                uStack_70 = (ulong)(uint)open;
                uStack_80 = (ulong)(uint)gap;
                auVar51 = auVar45;
                iVar59 = ptr_00[uVar27];
                lVar23 = auVar58._8_8_;
                while( true ) {
                  lVar26 = auVar51._0_8_;
                  if (size << 4 == uVar24) break;
                  plVar1 = (long *)((long)*ptr_02 + uVar24);
                  lVar28 = *plVar1;
                  lVar29 = plVar1[1];
                  plVar1 = (long *)((long)*ptr + uVar24);
                  auVar54._0_8_ = *plVar1 - uVar53;
                  auVar54._8_8_ = plVar1[1] - uStack_80;
                  plVar1 = (long *)((long)pvVar3 + uVar24 + (long)(int)(iVar9 * uVar15) * 0x10);
                  auVar60._0_8_ = iVar59 + *plVar1;
                  auVar60._8_8_ = lVar23 + plVar1[1];
                  plVar1 = (long *)((long)*ptr_03 + uVar24);
                  auVar50._0_8_ = auVar61._0_8_ + *plVar1;
                  auVar50._8_8_ = auVar61._8_8_ + plVar1[1];
                  auVar57._0_8_ = lVar28 - uVar49;
                  auVar57._8_8_ = lVar29 - uStack_70;
                  auVar31._0_8_ = -(ulong)(auVar50._0_8_ < lVar26);
                  auVar31._8_8_ = -(ulong)(auVar50._8_8_ < auVar51._8_8_);
                  auVar51 = blendvpd(auVar50,auVar51,auVar31);
                  auVar32._0_8_ = -(ulong)(auVar57._0_8_ < auVar54._0_8_);
                  auVar32._8_8_ = -(ulong)(auVar57._8_8_ < auVar54._8_8_);
                  auVar58 = blendvpd(auVar57,auVar54,auVar32);
                  auVar33._0_8_ = -(ulong)(auVar60._0_8_ < auVar58._0_8_);
                  auVar33._8_8_ = -(ulong)(auVar60._8_8_ < auVar58._8_8_);
                  auVar61 = blendvpd(auVar60,auVar58,auVar33);
                  *(undefined1 (*) [16])((long)*ptr + uVar24) = auVar58;
                  *(undefined1 (*) [16])((long)*ptr_01 + uVar24) = auVar61;
                  uVar24 = uVar24 + 0x10;
                  iVar59 = lVar28;
                  lVar23 = lVar29;
                }
                auVar51._8_4_ = auVar61._0_4_;
                auVar51._0_8_ = auVar61._0_8_;
                auVar51._12_4_ = auVar61._4_4_;
                lVar23 = ptr_00[uVar27 + 1];
                auVar48._8_8_ = auVar51._8_8_;
                auVar48._0_8_ = lVar23;
                lVar28 = lVar23 + (*ptr_03)[0];
                if (lVar28 < lVar26) {
                  lVar28 = lVar26;
                }
                auVar56._8_8_ = lVar28;
                auVar56._0_8_ = local_190;
                auVar34._0_8_ = -(ulong)((long)local_190 < lVar23);
                auVar34._8_8_ = -(ulong)(lVar28 < auVar48._8_8_);
                auVar51 = blendvpd(auVar56,auVar48,auVar34);
                uVar13 = uVar19;
                uVar18 = uVar19;
                for (uVar24 = 0; size << 4 != uVar24; uVar24 = uVar24 + 0x10) {
                  auVar46._0_8_ = auVar56._0_8_ - uVar53;
                  auVar46._8_8_ = auVar56._8_8_ - uStack_80;
                  auVar55._0_8_ = auVar51._0_8_ - uVar49;
                  auVar55._8_8_ = auVar51._8_8_ - uStack_70;
                  auVar35._0_8_ = -(ulong)(auVar55._0_8_ < auVar46._0_8_);
                  auVar35._8_8_ = -(ulong)(auVar55._8_8_ < auVar46._8_8_);
                  auVar56 = blendvpd(auVar55,auVar46,auVar35);
                  auVar51 = *(undefined1 (*) [16])((long)*ptr_01 + uVar24);
                  auVar36._0_8_ = -(ulong)(auVar56._0_8_ < auVar51._0_8_);
                  auVar36._8_8_ = -(ulong)(auVar56._8_8_ < auVar51._8_8_);
                  auVar51 = blendvpd(auVar56,auVar51,auVar36);
                  *(undefined1 (*) [16])((long)*ptr_02 + uVar24) = auVar51;
                  auVar37._0_8_ = -(ulong)(local_148._0_8_ < auVar51._0_8_);
                  auVar37._8_8_ = -(ulong)(local_148._8_8_ < auVar51._8_8_);
                  auVar61 = blendvpd(auVar51,local_148,auVar37);
                  auVar38._0_8_ = -(ulong)(auVar61._0_8_ < auVar56._0_8_);
                  auVar38._8_8_ = -(ulong)(auVar61._8_8_ < auVar56._8_8_);
                  local_148 = blendvpd(auVar56,auVar61,auVar38);
                  auVar39._0_8_ = -(ulong)(auVar51._0_8_ < auVar52._0_8_);
                  auVar39._8_8_ = -(ulong)(auVar51._8_8_ < auVar52._8_8_);
                  piVar5 = ((ppVar10->field_4).rowcols)->score_row;
                  *(int *)((long)piVar5 + uVar13) = auVar51._0_4_;
                  uVar18 = (long)piVar5 + uVar13;
                  *(int *)(size * uVar20 * 4 + uVar18) = auVar51._8_4_;
                  auVar52 = blendvpd(auVar51,auVar52,auVar39);
                  uVar13 = uVar13 + uVar20 * 4;
                }
                lVar23 = (*palVar12)[0];
                lVar26 = (*palVar12)[1];
                alVar42 = *palVar12;
                b[1] = uVar24;
                b[0] = uVar18;
                a[1] = (longlong)ppVar10;
                a[0] = uVar27;
                ppVar25 = ppVar10;
                _mm_cmpgt_epi64_rpl(a,b);
                auVar51 = extraout_XMM0 & local_f8;
                auVar40._0_8_ = -(ulong)(auVar43._0_8_ < lVar23);
                auVar40._8_8_ = -(ulong)(auVar43._8_8_ < lVar26);
                auVar43 = blendvpd(auVar43,(undefined1  [16])alVar42,auVar40);
                local_160 = (int)uVar27;
                if ((((((((((((((((auVar51 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar51 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar51 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar51 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar51 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar51 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar51 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar51 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar51 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar51 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar51 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar51 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar51[0xf] < '\0') {
                  local_194 = local_160;
                }
                uVar19 = uVar19 + 4;
                uVar27 = uVar27 + 1;
              }
              a_00[0] = (ulong)uVar21;
              if (s2_end != 0) {
                iVar9 = 0;
                uVar24 = 1;
                while( true ) {
                  local_190 = auVar43._8_8_;
                  if (iVar14 <= iVar9) break;
                  auVar6._8_8_ = 0;
                  auVar6._0_8_ = auVar43._0_8_;
                  auVar43 = auVar6 << 0x40;
                  iVar9 = 1;
                }
              }
              uVar22 = uVar21;
              if (s1_end != 0) {
                uVar20 = a_00[0];
                for (uVar24 = 0; uVar22 = (uint)uVar20, (uVar15 & 0x3fffffff) * 2 != (int)uVar24;
                    uVar24 = uVar24 + 1) {
                  ppVar25 = (parasail_result_t *)(uVar24 >> 1 & 0x7fffffff);
                  uVar17 = 0;
                  if ((uVar24 & 1) != 0) {
                    uVar17 = uVar15;
                  }
                  uVar17 = uVar17 + (int)ppVar25;
                  uVar19 = (ulong)uVar17;
                  if ((int)uVar17 < (int)uVar2) {
                    ppVar25 = (parasail_result_t *)(*ptr_02)[uVar24];
                    if ((long)local_190 < (long)ppVar25) {
                      uVar20 = (ulong)uVar17;
                      local_194 = iVar8;
                      local_190 = ppVar25;
                    }
                    else {
                      if ((int)uVar22 <= (int)uVar17) {
                        uVar17 = uVar22;
                      }
                      uVar19 = (ulong)uVar17;
                      if (local_194 != iVar8) {
                        uVar19 = uVar20;
                      }
                      if (ppVar25 == local_190) {
                        uVar20 = uVar19;
                      }
                    }
                  }
                }
              }
              if (s2_end == 0 && s1_end == 0) {
                uVar24 = 0;
                lVar7 = (*palVar12)[0];
                lVar41 = (*palVar12)[1];
                while (lVar30 = lVar7, local_190._0_4_ = (int)lVar41, uVar22 = uVar21,
                      local_194 = iVar8, (int)uVar24 < iVar14) {
                  lVar7 = 0;
                  lVar41 = lVar30;
                  uVar24 = 1;
                }
              }
              local_120 = (undefined4)local_138;
              uStack_11c = (undefined4)(local_138 >> 0x20);
              uStack_130._0_4_ = local_120;
              uStack_130._4_4_ = uStack_11c;
              b_00[1] = uVar24;
              b_00[0] = uVar19;
              a_00[1] = (longlong)ppVar25;
              _mm_cmpgt_epi64_rpl(a_00,b_00);
              auVar47._0_8_ = -(ulong)((long)local_138 < (long)local_148._0_8_);
              auVar47._8_8_ = -(ulong)(uStack_130 < (long)local_148._8_8_);
              auVar44._8_4_ = 0xffffffff;
              auVar44._0_8_ = 0xffffffffffffffff;
              auVar44._12_4_ = 0xffffffff;
              auVar45 = auVar44 ^ auVar47 | extraout_XMM0_00;
              if ((((((((((((((((auVar45 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar45 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar45 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar45 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar45 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar45 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar45 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar45 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar45 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar45 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar45 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar45 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar45[0xf] < '\0') {
                *(byte *)&ppVar10->flag = (byte)ppVar10->flag | 0x40;
                local_190._0_4_ = 0;
                local_194 = 0;
                uVar22 = 0;
              }
              ppVar10->score = (int)local_190;
              ppVar10->end_query = uVar22;
              ppVar10->end_ref = local_194;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar10;
            }
            __format = "%s: %s must be >= 0\n";
            pcVar16 = "gap";
          }
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_table_scan_profile_sse41_128_64",pcVar16);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi64(_mm_set1_epi64x_rpl(position),
            _mm_set_epi64x_rpl(0,1));
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi64(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi64(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 8);
        vHp = _mm_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vE, vGapE),
                    _mm_sub_epi64(vH, vGapO));
            vHp = _mm_add_epi64(vHp, vW);
            vF = _mm_max_epi64_rpl(vF, _mm_add_epi64(vHt, pvGapper[i]));
            vHt = _mm_max_epi64_rpl(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 8);
        vHt = _mm_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vF = _mm_max_epi64_rpl(vF, _mm_add_epi64(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 8);
            vFt = _mm_add_epi64(vFt, vSegLenXgap);
            vF = _mm_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 8);
        vF = _mm_add_epi64(vF, vNegInfFront);
        vH = _mm_max_epi64_rpl(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vF, vGapE),
                    _mm_sub_epi64(vH, vGapO));
            vH = _mm_max_epi64_rpl(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m128i vCompare;
            vH = _mm_load_si128(pvH + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi64_rpl(vH, vMaxH));
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}